

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::ClassId(TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_1d9;
  string local_1d8;
  TPZQuadTorus local_1b8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"TPZGeoElRefLess",&local_1d9);
  uVar1 = Hash(&local_1d8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadTorus::TPZQuadTorus(&local_1b8);
  iVar3 = pzgeom::TPZQuadTorus::ClassId(&local_1b8);
  pzgeom::TPZQuadTorus::~TPZQuadTorus(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}